

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  punct_facet *this;
  char *pcVar4;
  char *request_uri;
  Statement *pSVar5;
  pointer pSVar6;
  type pSVar7;
  long lVar8;
  double *pdVar9;
  ostream *poVar10;
  socklen_t __len;
  double dVar11;
  bool local_a22;
  exception *e;
  int idx_2;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  string local_798;
  allocator<char> local_771;
  string local_770;
  string local_750;
  Column local_730;
  double local_718;
  Column local_710;
  double local_6f8;
  int local_6f0;
  allocator<char> local_6e9;
  int idx_1;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  string local_680;
  allocator<char> local_659;
  string local_658;
  string local_638;
  byte local_612;
  allocator<char> local_611;
  undefined1 local_610 [6];
  bool isFirstRow;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  string local_560;
  allocator<char> local_539;
  string local_538;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  string local_488;
  allocator<char> local_461;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  string local_3b0;
  unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_> local_390;
  unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_> query;
  Database db;
  ostream *outputStream;
  string local_350;
  string local_330;
  allocator<char> local_309;
  string local_308;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  HttpHandler http;
  double local_e0;
  double local_d8;
  double maxTemp [4];
  double minTemp [4];
  locale local_90;
  locale local_88;
  int local_7c;
  string local_78 [55];
  allocator<char> local_41;
  undefined1 local_40 [8];
  string arg;
  size_t idx;
  char **argv_local;
  int argc_local;
  
  arg.field_2._8_8_ = 1;
  while( true ) {
    if ((ulong)(long)argc <= (ulong)arg.field_2._8_8_) {
      std::ios_base::getloc((ios_base *)(minTemp + 3));
      this = (punct_facet *)operator_new(0x18);
      *(undefined8 *)this = 0;
      *(undefined8 *)&this->field_0x8 = 0;
      *(undefined8 *)&this->field_0x10 = 0;
      punct_facet::punct_facet(this);
      std::locale::locale<punct_facet>(&local_90,(locale *)(minTemp + 3),this);
      std::ios::imbue(&local_88);
      std::locale::~locale(&local_88);
      std::locale::~locale(&local_90);
      std::locale::~locale((locale *)(minTemp + 3));
      local_e0 = std::numeric_limits<double>::infinity();
      std::fill_n<double*,int,double>(maxTemp + 3,4,&local_e0);
      dVar11 = std::numeric_limits<double>::infinity();
      http.zlib.reserved = (uLong)-dVar11;
      std::fill_n<double*,int,double>(&local_d8,4,(double *)&http.zlib.reserved);
      pcVar4 = getenv("HTTP_ACCEPT_ENCODING");
      request_uri = getenv("REQUEST_URI");
      HttpHandler::HttpHandler((HttpHandler *)local_188,pcVar4,request_uri,(ostream *)&std::cout);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"timespan",&local_1a9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"-1 hour",&local_1d1);
      HttpHandler::setDefault((HttpHandler *)local_188,&local_1a8,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"format",&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"csv",&local_221);
      HttpHandler::setDefault((HttpHandler *)local_188,&local_1f8,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"start",&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"now",&local_271);
      HttpHandler::setDefault((HttpHandler *)local_188,&local_248,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"clip",&local_299);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"0",&local_2c1);
      HttpHandler::setDefault((HttpHandler *)local_188,&local_298,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"format",&local_309);
      HttpHandler::param(&local_2e8,(HttpHandler *)local_188,&local_308);
      bVar2 = std::operator==(&local_2e8,"csv");
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
      if (bVar2) {
        HttpHandler::setContentType((HttpHandler *)local_188,"text/comma-separated-values");
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"format",(allocator<char> *)((long)&outputStream + 7));
        HttpHandler::param(&local_330,(HttpHandler *)local_188,&local_350);
        bVar2 = std::operator==(&local_330,"json");
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator((allocator<char> *)((long)&outputStream + 7));
        if (bVar2) {
          HttpHandler::setContentType((HttpHandler *)local_188,"application/json");
        }
      }
      HttpHandler::sendHeader((HttpHandler *)local_188);
      poVar3 = HttpHandler::getStream((HttpHandler *)local_188);
      __len = 0;
      SQLite::Database::Database((Database *)&query,"/srv/http/data/vbus.sqlite",1,0,(char *)0x0);
      SQLite::Database::setBusyTimeout((Database *)&query,3000);
      std::unique_ptr<SQLite::Statement,std::default_delete<SQLite::Statement>>::
      unique_ptr<std::default_delete<SQLite::Statement>,void>
                ((unique_ptr<SQLite::Statement,std::default_delete<SQLite::Statement>> *)&local_390)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"timespan",&local_3d1)
      ;
      HttpHandler::param(&local_3b0,(HttpHandler *)local_188,&local_3d0);
      bVar2 = std::operator==(&local_3b0,"single");
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
      if (bVar2) {
        pSVar5 = (Statement *)operator_new(0x70);
        SQLite::Statement::Statement
                  (pSVar5,(Database *)&query,
                   "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data ORDER BY id DESC LIMIT 1"
                  );
        std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::reset
                  (&local_390,pSVar5);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"timespan",&local_419);
        HttpHandler::param(&local_3f8,(HttpHandler *)local_188,&local_418);
        bVar2 = std::operator==(&local_3f8,"current");
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator(&local_419);
        if (bVar2) {
          pSVar5 = (Statement *)operator_new(0x70);
          SQLite::Statement::Statement
                    (pSVar5,(Database *)&query,
                     "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(\'now\', \'-5 minutes\')) ORDER BY id DESC LIMIT 1"
                    );
          std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::reset
                    (&local_390,pSVar5);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_460,"start",&local_461);
          HttpHandler::param(&local_440,(HttpHandler *)local_188,&local_460);
          bVar2 = std::operator==(&local_440,"now");
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)&local_460);
          std::allocator<char>::~allocator(&local_461);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            pSVar5 = (Statement *)operator_new(0x70);
            SQLite::Statement::Statement
                      (pSVar5,(Database *)&query,
                       "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(\'now\', ?)) ORDER BY time"
                      );
            std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::reset
                      (&local_390,pSVar5);
            pSVar6 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                     operator->(&local_390);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_580,"timespan",&local_581);
            HttpHandler::param(&local_560,(HttpHandler *)local_188,&local_580);
            SQLite::Statement::bind(pSVar6,1,(sockaddr *)&local_560,__len);
            std::__cxx11::string::~string((string *)&local_560);
            std::__cxx11::string::~string((string *)&local_580);
            std::allocator<char>::~allocator(&local_581);
          }
          else {
            pSVar5 = (Statement *)operator_new(0x70);
            SQLite::Statement::Statement
                      (pSVar5,(Database *)&query,
                       "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(?, \'utc\')) AND time < (SELECT DATETIME(?, \'utc\', ?)) ORDER BY time"
                      );
            std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::reset
                      (&local_390,pSVar5);
            pSVar6 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                     operator->(&local_390);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4a8,"start",&local_4a9);
            HttpHandler::param(&local_488,(HttpHandler *)local_188,&local_4a8);
            SQLite::Statement::bind(pSVar6,1,(sockaddr *)&local_488,__len);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::allocator<char>::~allocator(&local_4a9);
            pSVar6 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                     operator->(&local_390);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4f0,"start",&local_4f1);
            HttpHandler::param(&local_4d0,(HttpHandler *)local_188,&local_4f0);
            SQLite::Statement::bind(pSVar6,2,(sockaddr *)&local_4d0,__len);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::__cxx11::string::~string((string *)&local_4f0);
            std::allocator<char>::~allocator(&local_4f1);
            pSVar6 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                     operator->(&local_390);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_538,"timespan",&local_539);
            HttpHandler::param(&local_518,(HttpHandler *)local_188,&local_538);
            SQLite::Statement::bind(pSVar6,3,(sockaddr *)&local_518,__len);
            std::__cxx11::string::~string((string *)&local_518);
            std::__cxx11::string::~string((string *)&local_538);
            std::allocator<char>::~allocator(&local_539);
          }
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"format",&local_5c9);
      HttpHandler::param(&local_5a8,(HttpHandler *)local_188,&local_5c8);
      bVar2 = std::operator==(&local_5a8,"csv");
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::allocator<char>::~allocator(&local_5c9);
      if (bVar2) {
        poVar10 = std::operator<<(poVar3,
                                  "Datum,Ofen,Speicher-unten,Speicher-oben,Heizung,Ventil-Ofen,Ventil-Heizung"
                                 );
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_610,"format",&local_611);
        HttpHandler::param(&local_5f0,(HttpHandler *)local_188,(string *)local_610);
        bVar2 = std::operator==(&local_5f0,"json");
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)local_610);
        std::allocator<char>::~allocator(&local_611);
        if (bVar2) {
          poVar10 = std::operator<<(poVar3,"{\"data\":[");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        }
      }
      local_612 = 1;
      while( true ) {
        pSVar6 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                 operator->(&local_390);
        bVar2 = SQLite::Statement::executeStep(pSVar6);
        if (!bVar2) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"format",&local_659)
        ;
        HttpHandler::param(&local_638,(HttpHandler *)local_188,&local_658);
        bVar2 = std::operator==(&local_638,"csv");
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)&local_658);
        std::allocator<char>::~allocator(&local_659);
        if (bVar2) {
          pSVar7 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                   operator*(&local_390);
          bVar1 = local_612;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"clip",&local_6a1)
          ;
          HttpHandler::param(&local_680,(HttpHandler *)local_188,&local_6a0);
          bVar2 = std::operator==(&local_680,"1");
          printCsvResult(pSVar7,poVar3,(bool)(bVar1 & 1),bVar2);
          std::__cxx11::string::~string((string *)&local_680);
          std::__cxx11::string::~string((string *)&local_6a0);
          std::allocator<char>::~allocator(&local_6a1);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&idx_1,"format",&local_6e9);
          HttpHandler::param(&local_6c8,(HttpHandler *)local_188,(string *)&idx_1);
          bVar2 = std::operator==(&local_6c8,"json");
          std::__cxx11::string::~string((string *)&local_6c8);
          std::__cxx11::string::~string((string *)&idx_1);
          std::allocator<char>::~allocator(&local_6e9);
          if (bVar2) {
            pSVar7 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                     operator*(&local_390);
            printJsonResult(pSVar7,poVar3,(bool)(local_612 & 1));
          }
        }
        for (local_6f0 = 0; local_6f0 < 4; local_6f0 = local_6f0 + 1) {
          lVar8 = (long)local_6f0;
          pSVar6 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                   operator->(&local_390);
          SQLite::Statement::getColumn(&local_710,pSVar6,local_6f0 + 1);
          local_6f8 = SQLite::Column::getDouble(&local_710);
          pdVar9 = std::min<double>(maxTemp + lVar8 + 3,&local_6f8);
          maxTemp[(long)local_6f0 + 3] = *pdVar9;
          SQLite::Column::~Column(&local_710);
          lVar8 = (long)local_6f0;
          pSVar6 = std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::
                   operator->(&local_390);
          SQLite::Statement::getColumn(&local_730,pSVar6,local_6f0 + 1);
          local_718 = SQLite::Column::getDouble(&local_730);
          pdVar9 = std::max<double>(maxTemp + lVar8 + -1,&local_718);
          maxTemp[(long)local_6f0 + -1] = *pdVar9;
          SQLite::Column::~Column(&local_730);
        }
        HttpHandler::process((HttpHandler *)local_188);
        local_612 = 0;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"format",&local_771);
      HttpHandler::param(&local_750,(HttpHandler *)local_188,&local_770);
      bVar2 = std::operator==(&local_750,"json");
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_770);
      std::allocator<char>::~allocator(&local_771);
      if (bVar2) {
        std::allocator<char>::allocator();
        e._6_1_ = 0;
        e._5_1_ = 0;
        e._4_1_ = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b8,"timespan",&local_7b9);
        HttpHandler::param(&local_798,(HttpHandler *)local_188,&local_7b8);
        bVar2 = std::operator==(&local_798,"single");
        local_a22 = true;
        if (!bVar2) {
          std::allocator<char>::allocator();
          e._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&idx_2,"timespan",(allocator<char> *)((long)&e + 7));
          e._5_1_ = 1;
          HttpHandler::param(&local_7e0,(HttpHandler *)local_188,(string *)&idx_2);
          e._4_1_ = 1;
          local_a22 = std::operator==(&local_7e0,"current");
        }
        if ((e._4_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_7e0);
        }
        if ((e._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&idx_2);
        }
        if ((e._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
        }
        std::__cxx11::string::~string((string *)&local_798);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::allocator<char>::~allocator(&local_7b9);
        if (local_a22 == false) {
          poVar10 = (ostream *)
                    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::operator<<(poVar10,"]");
          for (e._0_4_ = 0; (int)e < 4; e._0_4_ = (int)e + 1) {
            poVar10 = std::operator<<(poVar3,",\"temp");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)e + 1);
            poVar10 = std::operator<<(poVar10,"\": {\"min\": ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,maxTemp[(long)(int)e + 3]);
            poVar10 = std::operator<<(poVar10,", \"max\": ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,maxTemp[(long)(int)e + -1]);
            poVar10 = std::operator<<(poVar10,"}");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          }
          std::operator<<(poVar3,"}");
        }
        else {
          poVar3 = (ostream *)
                   std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<(poVar3,"]}");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        HttpHandler::process((HttpHandler *)local_188);
      }
      HttpHandler::flush((HttpHandler *)local_188);
      std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::~unique_ptr
                (&local_390);
      SQLite::Database::~Database((Database *)&query);
      local_7c = 1;
      HttpHandler::~HttpHandler((HttpHandler *)local_188);
      return 0;
    }
    pcVar4 = argv[arg.field_2._8_8_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,pcVar4,&local_41);
    std::allocator<char>::~allocator(&local_41);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"-v");
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"--version"), bVar2)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"vbus-server ");
      GitMetadata::Version_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,local_78);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_78);
      local_7c = 1;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string((string *)local_40);
    if (local_7c != 0) break;
    arg.field_2._8_8_ = arg.field_2._8_8_ + 1;
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    for (size_t idx = 1; idx < argc; idx++)
    {
        auto arg = std::string(argv[idx]);
        if (arg == "-v" || arg == "--version")
        {
            std::cout << "vbus-server " << GitMetadata::Version() << std::endl;
            return 0;
        }
    }
    
    // Set decimal seperator to '.'
    std::cout.imbue(std::locale(std::cout.getloc(), new punct_facet()));

    double minTemp[4];
    double maxTemp[4];
    std::fill_n(minTemp, 4,  std::numeric_limits<double>::infinity());
    std::fill_n(maxTemp, 4, -std::numeric_limits<double>::infinity());

    // Get HTTP handler and set default paramter
    HttpHandler http(std::getenv("HTTP_ACCEPT_ENCODING"), std::getenv("REQUEST_URI"), std::cout);
    http.setDefault("timespan", "-1 hour");
    http.setDefault("format", "csv");
    http.setDefault("start", "now");
    http.setDefault("clip", "0");

    // Print HTTP header
    if (http.param("format") == "csv")
    {
        http.setContentType("text/comma-separated-values");
    }
    else if (http.param("format") == "json")
    {
        http.setContentType("application/json");
    }

    http.sendHeader();
    auto outputStream = http.getStream();

    try
    {
        SQLite::Database db(DB_PATH);
        db.setBusyTimeout(3000);

        // Build sqlite query
        std::unique_ptr<SQLite::Statement> query;

        if (http.param("timespan") == "single")
        {
            query.reset(new SQLite::Statement(db, SELECT_SINGLE));
        }
        else if (http.param("timespan") == "current")
        {
            query.reset(new SQLite::Statement(db, SELECT_CURRENT));

        }
        else
        {
            if (http.param("start") != "now")
            {
                query.reset(new SQLite::Statement(db, SELECT_TIMESPAN_RANGE));
                query->bind(1, http.param("start"));
                query->bind(2, http.param("start"));
                query->bind(3, http.param("timespan"));
            }
            else
            {
                query.reset(new SQLite::Statement(db, SELECT_TIMESPAN));
                query->bind(1, http.param("timespan"));
            }
        }

        if (http.param("format") == "csv")
        {
            *outputStream << CSV_HEADER << std::endl;
        }
        else if (http.param("format") == "json")
        {
            *outputStream << "{\"data\":[" << std::endl;
        }

        bool isFirstRow = true;

        while (query->executeStep())
        {
            if (http.param("format") == "csv")
            {
                printCsvResult(*query, *outputStream, isFirstRow, http.param("clip") == "1");
            }
            else if (http.param("format") == "json")
            {
                printJsonResult(*query, *outputStream, isFirstRow);
            }

            // Update min/max stats
            for (int idx=0; idx<4; idx++)
            {
                minTemp[idx] = std::min(minTemp[idx], query->getColumn(idx+1).getDouble());
                maxTemp[idx] = std::max(maxTemp[idx], query->getColumn(idx+1).getDouble());
            }

            http.process();

            isFirstRow = false;
        }

        // Add min/max stats to json response
        if (http.param("format") == "json")
        {
            if (http.param("timespan") == "single" || http.param("timespan") == "current")
            {
                *outputStream << std::endl << "]}" << std::endl;
            }
            else
            {
                *outputStream << std::endl << "]";

                for (int idx=0; idx<4; idx++)
                {
                    *outputStream << ",\"temp" << idx+1 << "\": {\"min\": " << minTemp[idx] << ", \"max\": " << maxTemp[idx] << "}" << std::endl;
                }

                *outputStream << "}";
            }

            http.process();
        }

        http.flush();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << std::endl;
        return 1;
    }

    return 0;
}